

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSGDiscrete.cpp
# Opt level: O1

string * __thiscall
POSGDiscrete::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,POSGDiscrete *this)

{
  pointer ppRVar1;
  string *psVar2;
  ulong uVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong uVar7;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  MultiAgentDecisionProcessDiscrete::SoftPrint_abi_cxx11_
            (&local_1e0,&this->super_MultiAgentDecisionProcessDiscrete);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  POSG::SoftPrint_abi_cxx11_
            (&local_1e0,(POSG *)&(this->super_MultiAgentDecisionProcessDiscrete).field_0x200);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (this->_m_initialized == true) {
    uVar6 = 0;
    while( true ) {
      uVar3 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscrete).
                                     super_MultiAgentDecisionProcess + 0x10))(this);
      psVar2 = local_1c0;
      uVar7 = (ulong)uVar6;
      if (uVar3 <= uVar7) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        return psVar2;
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Reward model for agent ",0x17);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      ppRVar1 = (this->_m_p_rModel).
                super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_p_rModel).
                        super__Vector_base<RewardModelMapping_*,_std::allocator<RewardModelMapping_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppRVar1 >> 3) <= uVar7)
      break;
      (**(code **)((long)(ppRVar1[uVar7]->super_RewardModel).super_RewardModelDiscreteInterface.
                         super_QTableInterface + 0x28))(&local_1e0);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar5 = &PTR__E_0059bd80;
  puVar5[1] = puVar5 + 3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(puVar5 + 1),"POSGDiscrete components (reward model) not initialized","");
  __cxa_throw(puVar5,&E::typeinfo,E::~E);
}

Assistant:

string POSGDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscrete::SoftPrint();
    ss << POSG::SoftPrint();

    if(_m_initialized)
    {
        for(Index agentI = 0; agentI < GetNrAgents(); agentI++)
        {
            ss << "Reward model for agent "<<agentI<<": " << endl;
            ss << _m_p_rModel.at(agentI)->SoftPrint() << endl;
        }
    }
    else
        throw E("POSGDiscrete components (reward model) not initialized");

    return(ss.str());
}